

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::addDrawBufferCommonTests
               (TestCaseGroup *root,PrePost prepost)

{
  Context *pCVar1;
  TestCase *pTVar2;
  Vector<bool,_4> local_e04;
  Maybe<tcu::Vector<bool,_4>_> local_e00;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_df0;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_dc8;
  Maybe<bool> local_da8;
  undefined1 local_d98 [8];
  BlendState bufferColorMaskState;
  Maybe<tcu::Vector<bool,_4>_> local_d28;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_d18;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_cf0;
  Maybe<bool> local_cd0;
  undefined1 local_cc0 [8];
  BlendState commonColorMaskState;
  BlendFunc local_c48;
  BlendFunc local_c40;
  SeparateBlendFunc local_c38;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_c28;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_c08;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_be0;
  Maybe<bool> local_bc0;
  undefined1 local_bb0 [8];
  BlendState separateFuncStateB;
  BlendFunc local_b38;
  BlendFunc local_b30;
  SeparateBlendFunc local_b28;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_b18;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_af8;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_ad0;
  Maybe<bool> local_ab0;
  undefined1 local_aa0 [8];
  BlendState separateFuncStateA;
  BlendFunc local_a28;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_a20;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_a00;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_9d8;
  Maybe<bool> local_9b8;
  undefined1 local_9a8 [8];
  BlendState funcStateB;
  BlendFunc local_930;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_928;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_908;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_8e0;
  Maybe<bool> local_8c0;
  undefined1 local_8b0 [8];
  BlendState funcStateA;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_838;
  uint local_80c;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_808;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_7f0;
  Maybe<bool> local_7d0;
  undefined1 local_7c0 [8];
  BlendState advancedEqStateB;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_748;
  uint local_71c;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_718;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_700;
  Maybe<bool> local_6e0;
  undefined1 local_6d0 [8];
  BlendState advancedEqStateA;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_658;
  SeparateBlendEq local_630;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_628;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_610;
  Maybe<bool> local_5f0;
  undefined1 local_5e0 [8];
  BlendState separateEqStateB;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_568;
  SeparateBlendEq local_540;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_538;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_520;
  Maybe<bool> local_500;
  undefined1 local_4f0 [8];
  BlendState separateEqStateA;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_478;
  uint local_44c;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_448;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_430;
  Maybe<bool> local_410;
  undefined1 local_400 [8];
  BlendState eqStateB;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_388;
  uint local_35c;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_358;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_340;
  Maybe<bool> local_320;
  undefined1 local_310 [8];
  BlendState eqStateA;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_298;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_270;
  bool local_249;
  Maybe<bool> local_248;
  undefined1 local_238 [8];
  BlendState enableState;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_1c0;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_198;
  bool local_171;
  Maybe<bool> local_170;
  undefined1 local_160 [8];
  BlendState disableState;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_e8;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_b0;
  Maybe<bool> local_90;
  undefined1 local_80 [8];
  BlendState emptyState;
  PrePost prepost_local;
  TestCaseGroup *root_local;
  
  emptyState.colorMask.field_1.m_align._4_4_ = prepost;
  tcu::Maybe<bool>::Maybe(&local_90);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_b0);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_e8);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&disableState.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_80,&local_90,&local_b0,&local_e8,
             (Maybe<tcu::Vector<bool,_4>_> *)&disableState.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&disableState.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_e8);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_b0);
  tcu::Maybe<bool>::~Maybe(&local_90);
  local_171 = false;
  tcu::just<bool>((tcu *)&local_170,&local_171);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_198);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_1c0);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&enableState.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_160,&local_170,&local_198,&local_1c0,
             (Maybe<tcu::Vector<bool,_4>_> *)&enableState.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&enableState.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_1c0);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_198);
  tcu::Maybe<bool>::~Maybe(&local_170);
  local_249 = true;
  tcu::just<bool>((tcu *)&local_248,&local_249);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_270);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_298);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&eqStateA.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_238,&local_248,&local_270,&local_298,
             (Maybe<tcu::Vector<bool,_4>_> *)&eqStateA.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&eqStateA.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_298);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_270);
  tcu::Maybe<bool>::~Maybe(&local_248);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_enable_buffer_enable",(BlendState *)local_238,
                          (BlendState *)local_238);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_disable_buffer_disable",(BlendState *)local_160,
                          (BlendState *)local_160);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_disable_buffer_enable",(BlendState *)local_160,
                          (BlendState *)local_238);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_enable_buffer_disable",(BlendState *)local_238,
                          (BlendState *)local_160);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_238);
  BlendState::~BlendState((BlendState *)local_160);
  tcu::nothing<bool>();
  local_35c = 0x8006;
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_358,&local_35c);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_340,&local_358);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_388);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&eqStateB.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_310,&local_320,&local_340,&local_388,
             (Maybe<tcu::Vector<bool,_4>_> *)&eqStateB.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&eqStateB.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_388);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_340);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_358);
  tcu::Maybe<bool>::~Maybe(&local_320);
  tcu::nothing<bool>();
  local_44c = 0x800a;
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_448,&local_44c);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_430,&local_448);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_478);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateA.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_400,&local_410,&local_430,&local_478,
             (Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateA.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateA.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_478);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_430);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_448);
  tcu::Maybe<bool>::~Maybe(&local_410);
  tcu::nothing<bool>();
  SeparateBlendEq::SeparateBlendEq(&local_540,0x8006,0x800a);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_538,&local_540);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_520,&local_538);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_568);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateB.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_4f0,&local_500,&local_520,&local_568,
             (Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateB.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateEqStateB.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_568);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_520);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_538);
  tcu::Maybe<bool>::~Maybe(&local_500);
  tcu::nothing<bool>();
  SeparateBlendEq::SeparateBlendEq(&local_630,0x800a,0x8006);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_628,&local_630);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_610,&local_628);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_658);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateA.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_5e0,&local_5f0,&local_610,&local_658,
             (Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateA.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateA.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_658);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_610);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_628);
  tcu::Maybe<bool>::~Maybe(&local_5f0);
  tcu::nothing<bool>();
  local_71c = 0x929e;
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_718,&local_71c);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_700,&local_718);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_748);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateB.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_6d0,&local_6e0,&local_700,&local_748,
             (Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateB.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&advancedEqStateB.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_748);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_700);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_718);
  tcu::Maybe<bool>::~Maybe(&local_6e0);
  tcu::nothing<bool>();
  local_80c = 0x9295;
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  Either(&local_808,&local_80c);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_7f0,&local_808);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_838);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&funcStateA.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_7c0,&local_7d0,&local_7f0,&local_838,
             (Maybe<tcu::Vector<bool,_4>_> *)&funcStateA.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&funcStateA.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_838);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_7f0);
  tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
  ~Either(&local_808);
  tcu::Maybe<bool>::~Maybe(&local_7d0);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_blend_eq_buffer_blend_eq",(BlendState *)local_310,
                          (BlendState *)local_400);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_blend_eq_buffer_separate_blend_eq",(BlendState *)local_310,
                          (BlendState *)local_5e0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createAdvancedEqDiffTest
                     (pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                      "common_blend_eq_buffer_advanced_blend_eq",(BlendState *)local_310,
                      (BlendState *)local_7c0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_separate_blend_eq_buffer_blend_eq",(BlendState *)local_4f0,
                          (BlendState *)local_400);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_separate_blend_eq_buffer_separate_blend_eq",
                          (BlendState *)local_4f0,(BlendState *)local_5e0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createAdvancedEqDiffTest
                     (pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                      "common_separate_blend_eq_buffer_advanced_blend_eq",(BlendState *)local_4f0,
                      (BlendState *)local_7c0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createAdvancedEqDiffTest
                     (pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                      "common_advanced_blend_eq_buffer_blend_eq",(BlendState *)local_6d0,
                      (BlendState *)local_400);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createAdvancedEqDiffTest
                     (pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                      "common_advanced_blend_eq_buffer_separate_blend_eq",(BlendState *)local_6d0,
                      (BlendState *)local_5e0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createAdvancedEqDiffTest
                     (pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                      "common_advanced_blend_eq_buffer_advanced_blend_eq",(BlendState *)local_6d0,
                      (BlendState *)local_7c0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_7c0);
  BlendState::~BlendState((BlendState *)local_6d0);
  BlendState::~BlendState((BlendState *)local_5e0);
  BlendState::~BlendState((BlendState *)local_4f0);
  BlendState::~BlendState((BlendState *)local_400);
  BlendState::~BlendState((BlendState *)local_310);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_8e0);
  BlendFunc::BlendFunc(&local_930,0x302,0x304);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::Either(&local_928,&local_930);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_908,&local_928);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&funcStateB.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_8b0,&local_8c0,&local_8e0,&local_908,
             (Maybe<tcu::Vector<bool,_4>_> *)&funcStateB.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&funcStateB.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_908);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::~Either(&local_928);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_8e0);
  tcu::Maybe<bool>::~Maybe(&local_8c0);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_9d8);
  BlendFunc::BlendFunc(&local_a28,0x304,0x302);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::Either(&local_a20,&local_a28);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_a00,&local_a20);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateA.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_9a8,&local_9b8,&local_9d8,&local_a00,
             (Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateA.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateA.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_a00);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::~Either(&local_a20);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_9d8);
  tcu::Maybe<bool>::~Maybe(&local_9b8);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_ad0);
  BlendFunc::BlendFunc(&local_b30,0x302,0x304);
  BlendFunc::BlendFunc(&local_b38,0x303,0x305);
  SeparateBlendFunc::SeparateBlendFunc(&local_b28,local_b30,local_b38);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::Either(&local_b18,&local_b28);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_af8,&local_b18);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateB.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_aa0,&local_ab0,&local_ad0,&local_af8,
             (Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateB.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&separateFuncStateB.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_af8);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::~Either(&local_b18);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_ad0);
  tcu::Maybe<bool>::~Maybe(&local_ab0);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_be0);
  BlendFunc::BlendFunc(&local_c40,0x304,0x302);
  BlendFunc::BlendFunc(&local_c48,0x305,0x303);
  SeparateBlendFunc::SeparateBlendFunc(&local_c38,local_c40,local_c48);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::Either(&local_c28,&local_c38);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_c08,&local_c28);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&commonColorMaskState.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)local_bb0,&local_bc0,&local_be0,&local_c08,
             (Maybe<tcu::Vector<bool,_4>_> *)&commonColorMaskState.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&commonColorMaskState.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_c08);
  tcu::
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  ::~Either(&local_c28);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_be0);
  tcu::Maybe<bool>::~Maybe(&local_bc0);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_blend_func_buffer_blend_func",(BlendState *)local_8b0,
                          (BlendState *)local_9a8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_blend_func_buffer_separate_blend_func",(BlendState *)local_8b0,
                          (BlendState *)local_bb0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_separate_blend_func_buffer_blend_func",(BlendState *)local_aa0,
                          (BlendState *)local_9a8);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_separate_blend_func_buffer_separate_blend_func",
                          (BlendState *)local_aa0,(BlendState *)local_bb0);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_bb0);
  BlendState::~BlendState((BlendState *)local_aa0);
  BlendState::~BlendState((BlendState *)local_9a8);
  BlendState::~BlendState((BlendState *)local_8b0);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_cf0);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_d18);
  tcu::Vector<bool,_4>::Vector
            ((Vector<bool,_4> *)((long)&bufferColorMaskState.colorMask.field_1 + 4),true,false,true,
             false);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe
            (&local_d28,(Vector<bool,_4> *)((long)&bufferColorMaskState.colorMask.field_1 + 4));
  BlendState::BlendState((BlendState *)local_cc0,&local_cd0,&local_cf0,&local_d18,&local_d28);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe(&local_d28);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_d18);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_cf0);
  tcu::Maybe<bool>::~Maybe(&local_cd0);
  tcu::nothing<bool>();
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&local_dc8);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&local_df0);
  tcu::Vector<bool,_4>::Vector(&local_e04,false,true,false,true);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe(&local_e00,&local_e04);
  BlendState::BlendState((BlendState *)local_d98,&local_da8,&local_dc8,&local_df0,&local_e00);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe(&local_e00);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_df0);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_dc8);
  tcu::Maybe<bool>::~Maybe(&local_da8);
  pCVar1 = TestCaseGroup::getContext(root);
  pTVar2 = createDiffTest(pCVar1,emptyState.colorMask.field_1.m_align._4_4_,
                          "common_color_mask_buffer_color_mask",(BlendState *)local_cc0,
                          (BlendState *)local_d98);
  tcu::TestNode::addChild((TestNode *)root,(TestNode *)pTVar2);
  BlendState::~BlendState((BlendState *)local_d98);
  BlendState::~BlendState((BlendState *)local_cc0);
  BlendState::~BlendState((BlendState *)local_80);
  return;
}

Assistant:

void addDrawBufferCommonTests (TestCaseGroup* root, PrePost prepost)
{
	const BlendState		emptyState	= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

	{
		const BlendState	disableState	= BlendState(just(false), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	enableState		= BlendState(just(true), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_enable",	enableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_disable",	disableState,	disableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_disable_buffer_enable",	disableState,	enableState));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_enable_buffer_disable",	enableState,	disableState));
	}

	{
		const BlendState	eqStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_ADD), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	eqStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_FUNC_SUBTRACT), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	separateEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_ADD, GL_FUNC_SUBTRACT)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	separateEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(SeparateBlendEq(GL_FUNC_SUBTRACT, GL_FUNC_ADD)), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		const BlendState	advancedEqStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_DIFFERENCE), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
		const BlendState	advancedEqStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(GL_SCREEN), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_blend_eq", eqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_separate_blend_eq", eqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_blend_eq_buffer_advanced_blend_eq", eqStateA, advancedEqStateB));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_blend_eq", separateEqStateA, eqStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_separate_blend_eq", separateEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_separate_blend_eq_buffer_advanced_blend_eq", separateEqStateA, advancedEqStateB));

		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_blend_eq", advancedEqStateA, eqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_separate_blend_eq", advancedEqStateA, separateEqStateB));
		root->addChild(createAdvancedEqDiffTest(root->getContext(), prepost, "common_advanced_blend_eq_buffer_advanced_blend_eq", advancedEqStateA, advancedEqStateB));
	}

	{
		const BlendState	funcStateA			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA)), Maybe<BVec4>());
		const BlendState	funcStateB			= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA)), Maybe<BVec4>());
		const BlendState	separateFuncStateA	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA), BlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_ONE_MINUS_DST_ALPHA))), Maybe<BVec4>());
		const BlendState	separateFuncStateB	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(SeparateBlendFunc(BlendFunc(GL_DST_ALPHA, GL_SRC_ALPHA), BlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA))), Maybe<BVec4>());

		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_blend_func",					funcStateA,			funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_blend_func_buffer_separate_blend_func",			funcStateA,			separateFuncStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_blend_func",			separateFuncStateA,	funcStateB));
		root->addChild(createDiffTest(root->getContext(), prepost, "common_separate_blend_func_buffer_separate_blend_func",	separateFuncStateA,	separateFuncStateB));
	}

	{
		const BlendState	commonColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(true, false, true, false)));
		const BlendState	bufferColorMaskState	= BlendState(tcu::nothing<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>(BVec4(false, true, false, true)));

		root->addChild(createDiffTest(root->getContext(), prepost, "common_color_mask_buffer_color_mask", commonColorMaskState, bufferColorMaskState));
	}
}